

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Printer.h
# Opt level: O3

void __thiscall soul::heart::Printer::PrinterStream::printStateVariables(PrinterStream *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Role RVar2;
  pool_ref<soul::heart::Variable> *ppVar3;
  CodePrinter *pCVar4;
  string *name;
  Expression *e;
  PrinterStream *pPVar5;
  size_t sVar6;
  int line;
  char *pcVar7;
  Variable *pVVar8;
  pointer ppVar9;
  ArrayView<soul::pool_ref<soul::heart::Variable>_> variables;
  string_view text;
  string_view text_00;
  string_view text_01;
  char s [2];
  char s_1 [2];
  VariableListByType list;
  char local_ba [2];
  PrinterStream *local_b8;
  string local_b0;
  char *local_90;
  char *local_88;
  pointer local_80;
  string local_78;
  pointer local_58;
  pointer local_50;
  vector<soul::heart::Utilities::VariableListByType::VariablesWithType,_std::allocator<soul::heart::Utilities::VariableListByType::VariablesWithType>_>
  local_48;
  
  ppVar3 = (this->module->stateVariables).stateVariables.items;
  variables.e = ppVar3 + (this->module->stateVariables).stateVariables.numActive;
  variables.s = ppVar3;
  Utilities::VariableListByType::VariableListByType((VariableListByType *)&local_48,variables);
  local_58 = local_48.
             super__Vector_base<soul::heart::Utilities::VariableListByType::VariablesWithType,_std::allocator<soul::heart::Utilities::VariableListByType::VariablesWithType>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if (local_48.
      super__Vector_base<soul::heart::Utilities::VariableListByType::VariablesWithType,_std::allocator<soul::heart::Utilities::VariableListByType::VariablesWithType>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_48.
      super__Vector_base<soul::heart::Utilities::VariableListByType::VariablesWithType,_std::allocator<soul::heart::Utilities::VariableListByType::VariablesWithType>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    paVar1 = &local_b0.field_2;
    local_88 = "operator const std::basic_string<char> &";
    local_90 = "isValid()";
    local_b8 = this;
    do {
      ppVar9 = ((local_48.
                 super__Vector_base<soul::heart::Utilities::VariableListByType::VariablesWithType,_std::allocator<soul::heart::Utilities::VariableListByType::VariablesWithType>_>
                 ._M_impl.super__Vector_impl_data._M_start)->variables).
               super__Vector_base<soul::pool_ref<soul::heart::Variable>,_std::allocator<soul::pool_ref<soul::heart::Variable>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_50 = ((local_48.
                   super__Vector_base<soul::heart::Utilities::VariableListByType::VariablesWithType,_std::allocator<soul::heart::Utilities::VariableListByType::VariablesWithType>_>
                   ._M_impl.super__Vector_impl_data._M_start)->variables).
                 super__Vector_base<soul::pool_ref<soul::heart::Variable>,_std::allocator<soul::pool_ref<soul::heart::Variable>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      local_80 = local_48.
                 super__Vector_base<soul::heart::Utilities::VariableListByType::VariablesWithType,_std::allocator<soul::heart::Utilities::VariableListByType::VariablesWithType>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      if (ppVar9 != local_50) {
        do {
          pCVar4 = this->out;
          RVar2 = ppVar9->object->role;
          pcVar7 = "var ";
          if (RVar2 == constant) {
            pcVar7 = "let ";
          }
          if (RVar2 == external) {
            pcVar7 = "let external ";
          }
          text._M_len = (ulong)(RVar2 == external) * 9 + 4;
          text._M_str = pcVar7;
          choc::text::CodePrinter::writeBlock(pCVar4,text);
          getTypeDescription_abi_cxx11_(&local_78,this,&local_80->type);
          text_00._M_str._2_6_ = local_78._M_dataplus._M_p._2_6_;
          text_00._M_str._0_2_ = local_78._M_dataplus._M_p._0_2_;
          text_00._M_len = local_78._M_string_length;
          choc::text::CodePrinter::writeBlock(pCVar4,text_00);
          local_ba[0] = ' ';
          local_ba[1] = '\0';
          local_b0._M_dataplus._M_p = (pointer)paVar1;
          sVar6 = strlen(local_ba);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_b0,local_ba,local_ba + sVar6);
          choc::text::CodePrinter::append(pCVar4,&local_b0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b0._M_dataplus._M_p != paVar1) {
            operator_delete(local_b0._M_dataplus._M_p,
                            CONCAT62(local_b0.field_2._M_allocated_capacity._2_6_,
                                     local_b0.field_2._M_allocated_capacity._0_2_) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT62(local_78._M_dataplus._M_p._2_6_,local_78._M_dataplus._M_p._0_2_) !=
              &local_78.field_2) {
            operator_delete((undefined1 *)
                            CONCAT62(local_78._M_dataplus._M_p._2_6_,local_78._M_dataplus._M_p._0_2_
                                    ),local_78.field_2._M_allocated_capacity + 1);
          }
          name = (ppVar9->object->name).name;
          if (name == (string *)0x0) {
            line = 0x21;
LAB_00237ec1:
            throwInternalCompilerError(local_90,local_88,line);
          }
          printVarWithPrefix(local_b8,name);
          pVVar8 = ppVar9->object;
          if ((pVVar8->initialValue).object != (Expression *)0x0) {
            text_01._M_str = " = ";
            text_01._M_len = 3;
            choc::text::CodePrinter::writeBlock(local_b8->out,text_01);
            e = (ppVar9->object->initialValue).object;
            if (e == (Expression *)0x0) {
              line = 0x3b;
              local_90 = "object != nullptr";
              local_88 = "operator*";
              goto LAB_00237ec1;
            }
            printExpression(local_b8,e);
            pVVar8 = ppVar9->object;
          }
          pPVar5 = local_b8;
          printDescription(local_b8,&pVVar8->annotation);
          pCVar4 = pPVar5->out;
          local_78._M_dataplus._M_p._0_2_ = 0x3b;
          local_b0._M_dataplus._M_p = (pointer)paVar1;
          sVar6 = strlen((char *)&local_78);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_b0,&local_78,(long)&local_78._M_dataplus._M_p + sVar6);
          choc::text::CodePrinter::append(pCVar4,&local_b0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b0._M_dataplus._M_p != paVar1) {
            operator_delete(local_b0._M_dataplus._M_p,
                            CONCAT62(local_b0.field_2._M_allocated_capacity._2_6_,
                                     local_b0.field_2._M_allocated_capacity._0_2_) + 1);
          }
          local_b0.field_2._M_allocated_capacity._0_2_ = 10;
          local_b0._M_string_length = 1;
          local_b0._M_dataplus._M_p = (pointer)paVar1;
          choc::text::CodePrinter::append(pCVar4,&local_b0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b0._M_dataplus._M_p != paVar1) {
            operator_delete(local_b0._M_dataplus._M_p,
                            CONCAT62(local_b0.field_2._M_allocated_capacity._2_6_,
                                     local_b0.field_2._M_allocated_capacity._0_2_) + 1);
          }
          ppVar9 = ppVar9 + 1;
          this = local_b8;
        } while (ppVar9 != local_50);
      }
      local_48.
      super__Vector_base<soul::heart::Utilities::VariableListByType::VariablesWithType,_std::allocator<soul::heart::Utilities::VariableListByType::VariablesWithType>_>
      ._M_impl.super__Vector_impl_data._M_start = local_80 + 1;
    } while (local_48.
             super__Vector_base<soul::heart::Utilities::VariableListByType::VariablesWithType,_std::allocator<soul::heart::Utilities::VariableListByType::VariablesWithType>_>
             ._M_impl.super__Vector_impl_data._M_start != local_58);
  }
  std::
  vector<soul::heart::Utilities::VariableListByType::VariablesWithType,_std::allocator<soul::heart::Utilities::VariableListByType::VariablesWithType>_>
  ::~vector(&local_48);
  return;
}

Assistant:

void printStateVariables()
        {
            heart::Utilities::VariableListByType list (module.stateVariables.get());

            for (auto& type : list.types)
            {
                for (auto& v : type.variables)
                {
                    out << (v->isExternal() ? "let external " : (v->isConstant() ? "let " : "var "))
                        << getTypeDescription (type.type) << ' ';

                    printVarWithPrefix (v->name);

                    if (v->initialValue != nullptr)
                    {
                        out << " = ";
                        printExpression (*v->initialValue);
                    }

                    printDescription (v->annotation);
                    out << ';' << newLine;
                }
            }
        }